

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ExportModuleField::~ExportModuleField(ExportModuleField *this)

{
  ~ExportModuleField(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

explicit ExportModuleField(const Location& loc = Location())
      : ModuleFieldMixin<ModuleFieldType::Export>(loc) {}